

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_lightbuffer.cpp
# Opt level: O2

void __thiscall FLightBuffer::FLightBuffer(FLightBuffer *this)

{
  GLsizeiptr GVar1;
  uint uVar2;
  float *pfVar3;
  uint uVar4;
  uint uVar5;
  
  (this->mIndices).Array = (int *)0x0;
  (this->mIndices).Most = 0;
  (this->mIndices).Count = 0;
  this->mBufferSize = 160000;
  this->mByteSize = 640000;
  if (((byte)gl.flags & 4) == 0) {
    uVar2 = 0x800;
    if (gl.maxuniformblock < 0x8010) {
      uVar2 = gl.maxuniformblock >> 4;
    }
    uVar4 = uVar2 >> 1;
    uVar5 = 0x8a11;
  }
  else {
    uVar4 = 0;
    uVar2 = 160000;
    uVar5 = 0x90d2;
  }
  this->mBufferType = uVar5;
  this->mBlockSize = uVar2;
  this->mBlockAlign = uVar4;
  (*_ptrc_glGenBuffers)(1,&this->mBufferId);
  (*_ptrc_glBindBufferBase)(this->mBufferType,1,this->mBufferId);
  (*_ptrc_glBindBuffer)(this->mBufferType,this->mBufferId);
  GVar1 = (GLsizeiptr)this->mByteSize;
  if (gl.lightmethod == 2) {
    (*_ptrc_glBufferStorage)(this->mBufferType,GVar1,(void *)0x0,0xc2);
    pfVar3 = (float *)(*_ptrc_glMapBufferRange)
                                (this->mBufferType,0,(GLsizeiptr)this->mByteSize,0xc2);
  }
  else {
    pfVar3 = (float *)0x0;
    (*_ptrc_glBufferData)(this->mBufferType,GVar1,(void *)0x0,0x88e8);
  }
  this->mBufferPointer = pfVar3;
  Clear(this);
  this->mLastMappedIndex = 0xffffffff;
  return;
}

Assistant:

FLightBuffer::FLightBuffer()
{

	mBufferSize = INITIAL_BUFFER_SIZE;
	mByteSize = mBufferSize * sizeof(float);
	if (gl.flags & RFL_SHADER_STORAGE_BUFFER)
	{
		mBufferType = GL_SHADER_STORAGE_BUFFER;
		mBlockAlign = 0;
		mBlockSize = mBufferSize;
	}
	else
	{
		mBufferType = GL_UNIFORM_BUFFER;
		mBlockSize = gl.maxuniformblock / 16;
		if (mBlockSize > 2048) mBlockSize = 2048;	// we don't really need a larger buffer
		mBlockAlign = mBlockSize / 2;
	}

	glGenBuffers(1, &mBufferId);
	glBindBufferBase(mBufferType, LIGHTBUF_BINDINGPOINT, mBufferId);
	glBindBuffer(mBufferType, mBufferId);	// Note: Some older AMD drivers don't do that in glBindBufferBase, as they should.
	if (gl.lightmethod == LM_DIRECT)
	{
		glBufferStorage(mBufferType, mByteSize, NULL, GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_COHERENT_BIT);
		mBufferPointer = (float*)glMapBufferRange(mBufferType, 0, mByteSize, GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_COHERENT_BIT);
	}
	else
	{
		glBufferData(mBufferType, mByteSize, NULL, GL_DYNAMIC_DRAW);
		mBufferPointer = NULL;
	}

	Clear();
	mLastMappedIndex = UINT_MAX;
}